

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void test_qpixl_frqi_util_convert_angles_grayscale<float>(void)

{
  float fVar1;
  __type _Var2;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  bool bVar3;
  reference pvVar4;
  char *pcVar5;
  AssertHelper local_2d8;
  Message local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_15;
  Message local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_14;
  Message local_290;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_13;
  Message local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_12;
  Message local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_11;
  Message local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_10;
  Message local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_9;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_8;
  Message local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_7;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_6;
  Message local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_5;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_4;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_3;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_2;
  Message local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  float scal;
  float pi2;
  float eps;
  size_t maxval;
  float local_b8 [8];
  iterator local_98;
  size_type local_90;
  undefined1 local_88 [8];
  vector<float,_std::allocator<float>_> a_c;
  allocator<float> local_59;
  float local_58 [10];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<float,_std::allocator<float>_> a;
  
  local_58[4] = 5.0;
  local_58[5] = 6.0;
  local_58[6] = 7.0;
  local_58[7] = 8.0;
  local_58[0] = 1.0;
  local_58[1] = 2.0;
  local_58[2] = 3.0;
  local_58[3] = 4.0;
  local_30 = local_58;
  local_28 = 8;
  std::allocator<float>::allocator(&local_59);
  __l_00._M_len = local_28;
  __l_00._M_array = local_30;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_20,__l_00,&local_59);
  std::allocator<float>::~allocator(&local_59);
  local_b8[4] = 5.0;
  local_b8[5] = 6.0;
  local_b8[6] = 7.0;
  local_b8[7] = 8.0;
  local_b8[0] = 1.0;
  local_b8[1] = 2.0;
  local_b8[2] = 3.0;
  local_b8[3] = 4.0;
  local_98 = local_b8;
  local_90 = 8;
  std::allocator<float>::allocator((allocator<float> *)((long)&maxval + 7));
  __l._M_len = local_90;
  __l._M_array = local_98;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_88,__l,
             (allocator<float> *)((long)&maxval + 7));
  std::allocator<float>::~allocator((allocator<float> *)((long)&maxval + 7));
  std::numeric_limits<float>::epsilon();
  _Var2 = std::atan<int>(1);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = (float)(_Var2 + _Var2) / 255.0;
  qpixl::frqi::convertToAngles<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_20,0xff);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,0);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_e8,"a[ 0]","a_c[ 0]*scal","10*eps",(double)fVar1,
             (double)(*pvVar4 *
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_),1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar3) {
    testing::Message::Message(&local_f0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x113,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,1);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,1);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_108,"a[ 1]","a_c[ 1]*scal","10*eps",(double)fVar1,
             (double)(*pvVar4 *
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_),1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar3) {
    testing::Message::Message(&local_110);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x114,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,2);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,2);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_128,"a[ 2]","a_c[ 2]*scal","10*eps",(double)fVar1,
             (double)(*pvVar4 *
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_),1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar3) {
    testing::Message::Message(&local_130);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x115,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,3);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,3);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_148,"a[ 3]","a_c[ 3]*scal","10*eps",(double)fVar1,
             (double)(*pvVar4 *
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_),1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar3) {
    testing::Message::Message(&local_150);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x116,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,4);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,4);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_168,"a[ 4]","a_c[ 4]*scal","10*eps",(double)fVar1,
             (double)(*pvVar4 *
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_),1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar3) {
    testing::Message::Message(&local_170);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x117,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,5);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,5);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_188,"a[ 5]","a_c[ 5]*scal","10*eps",(double)fVar1,
             (double)(*pvVar4 *
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_),1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar3) {
    testing::Message::Message(&local_190);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x118,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,6);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,6);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1a8,"a[ 6]","a_c[ 6]*scal","10*eps",(double)fVar1,
             (double)(*pvVar4 *
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_),1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar3) {
    testing::Message::Message(&local_1b0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x119,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,7);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,7);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1c8,"a[ 7]","a_c[ 7]*scal","10*eps",(double)fVar1,
             (double)(*pvVar4 *
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_),1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar3) {
    testing::Message::Message(&local_1d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x11a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  qpixl::frqi::convertToGrayscale<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_20,0xff);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,0);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1e8,"a[ 0]","a_c[ 0]","10*eps",(double)fVar1,(double)*pvVar4,
             1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar3) {
    testing::Message::Message(&local_1f0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x11d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,1);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,1);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_208,"a[ 1]","a_c[ 1]","10*eps",(double)fVar1,(double)*pvVar4,
             1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar3) {
    testing::Message::Message(&local_210);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x11e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,2);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,2);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_228,"a[ 2]","a_c[ 2]","10*eps",(double)fVar1,(double)*pvVar4,
             1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar3) {
    testing::Message::Message(&local_230);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x11f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,3);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,3);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_248,"a[ 3]","a_c[ 3]","10*eps",(double)fVar1,(double)*pvVar4,
             1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar3) {
    testing::Message::Message(&local_250);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x120,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,4);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,4);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_268,"a[ 4]","a_c[ 4]","10*eps",(double)fVar1,(double)*pvVar4,
             1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar3) {
    testing::Message::Message(&local_270);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x121,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,5);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,5);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_288,"a[ 5]","a_c[ 5]","10*eps",(double)fVar1,(double)*pvVar4,
             1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar3) {
    testing::Message::Message(&local_290);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x122,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,6);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,6);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_2a8,"a[ 6]","a_c[ 6]","10*eps",(double)fVar1,(double)*pvVar4,
             1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar3) {
    testing::Message::Message(&local_2b0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x123,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,7);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_88,7);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_2c8,"a[ 7]","a_c[ 7]","10*eps",(double)fVar1,(double)*pvVar4,
             1.1920928955078125e-06);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar3) {
    testing::Message::Message(&local_2d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x124,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_88);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_20);
  return;
}

Assistant:

void test_qpixl_frqi_util_convert_angles_grayscale() {
  std::vector< R > a = { 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 } ;
  std::vector< R > a_c = { 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 } ;
  size_t maxval = 255 ;

  const R eps = std::numeric_limits< R >::epsilon() ;
  const R pi2 = 2 * std::atan(1) ;
  const R scal = pi2 / maxval ;

  qpixl::frqi::convertToAngles( a , maxval ) ;
  EXPECT_NEAR( a[ 0] , a_c[ 0]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 1] , a_c[ 1]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 2] , a_c[ 2]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 3] , a_c[ 3]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 4] , a_c[ 4]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 5] , a_c[ 5]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 6] , a_c[ 6]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 7] , a_c[ 7]*scal  , 10*eps ) ;
  
  qpixl::frqi::convertToGrayscale( a , maxval ) ;
  EXPECT_NEAR( a[ 0] , a_c[ 0]  , 10*eps ) ;
  EXPECT_NEAR( a[ 1] , a_c[ 1]  , 10*eps ) ;
  EXPECT_NEAR( a[ 2] , a_c[ 2]  , 10*eps ) ;
  EXPECT_NEAR( a[ 3] , a_c[ 3]  , 10*eps ) ;
  EXPECT_NEAR( a[ 4] , a_c[ 4]  , 10*eps ) ;
  EXPECT_NEAR( a[ 5] , a_c[ 5]  , 10*eps ) ;
  EXPECT_NEAR( a[ 6] , a_c[ 6]  , 10*eps ) ;
  EXPECT_NEAR( a[ 7] , a_c[ 7]  , 10*eps ) ;

}